

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall HPresolve::setVariablesToBoundForForcingRow(HPresolve *this,int row,bool isLower)

{
  initializer_list<double> __l;
  ostream *poVar1;
  reference pvVar2;
  reference pvVar3;
  byte in_DL;
  int in_ESI;
  long in_RDI;
  vector<double,_std::allocator<double>_> bnds;
  double value;
  int col;
  int k;
  double in_stack_00000160;
  int in_stack_0000016c;
  HPresolve *in_stack_00000170;
  value_type *in_stack_ffffffffffffff18;
  ostream *in_stack_ffffffffffffff20;
  ostream *in_stack_ffffffffffffff28;
  HPresolve *in_stack_ffffffffffffff30;
  allocator_type *__a;
  vector<double,_std::allocator<double>_> *this_00;
  undefined4 in_stack_ffffffffffffff58;
  int iVar4;
  ostream *in_stack_ffffffffffffff60;
  undefined1 local_59 [25];
  undefined8 local_40;
  value_type local_20;
  value_type local_18;
  int local_14;
  byte local_d;
  int local_c [3];
  
  local_d = in_DL & 1;
  if (0 < *(int *)(in_RDI + 0x7c8)) {
    local_c[0] = in_ESI;
    poVar1 = std::operator<<((ostream *)&std::cout,"PR: Forcing row ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c[0]);
    in_stack_ffffffffffffff60 =
         std::operator<<(poVar1," removed. Following variables too:   nzRow=");
    pvVar2 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
                        (size_type)in_stack_ffffffffffffff18);
    poVar1 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff60,*pvVar2);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  pvVar2 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
                      (size_type)in_stack_ffffffffffffff18);
  *pvVar2 = 0;
  addChange(in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
            (int)in_stack_ffffffffffffff28,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
  pvVar2 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
                      (size_type)in_stack_ffffffffffffff18);
  local_14 = *pvVar2;
  do {
    iVar4 = local_14;
    pvVar2 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
                        (size_type)in_stack_ffffffffffffff18);
    if (*pvVar2 <= iVar4) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
                          (size_type)in_stack_ffffffffffffff18);
      if (*pvVar2 == 1) {
        std::__cxx11::list<int,_std::allocator<int>_>::remove
                  ((list<int,_std::allocator<int>_> *)(in_RDI + 0xa10),(char *)local_c);
      }
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xab8),4);
      *pvVar2 = *pvVar2 + 1;
      return;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
                        (size_type)in_stack_ffffffffffffff18);
    local_18 = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
                        (size_type)in_stack_ffffffffffffff18);
    if (*pvVar2 != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,
                          (size_type)in_stack_ffffffffffffff18);
      if ((0.0 < *pvVar3 || *pvVar3 == 0.0) || ((local_d & 1) == 0)) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,
                            (size_type)in_stack_ffffffffffffff18);
        if ((0.0 < *pvVar3) && ((local_d & 1) == 0)) goto LAB_001a3312;
        pvVar3 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,
                            (size_type)in_stack_ffffffffffffff18);
        local_20 = *pvVar3;
      }
      else {
LAB_001a3312:
        pvVar3 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,
                            (size_type)in_stack_ffffffffffffff18);
        local_20 = *pvVar3;
      }
      setPrimalValue(in_stack_00000170,in_stack_0000016c,in_stack_00000160);
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,
                          (size_type)in_stack_ffffffffffffff18);
      __a = (allocator_type *)*pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,
                          (size_type)in_stack_ffffffffffffff18);
      *pvVar3 = (value_type)__a;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,
                          (size_type)in_stack_ffffffffffffff18);
      local_59._1_8_ = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,
                          (size_type)in_stack_ffffffffffffff18);
      local_59._9_8_ = *pvVar3;
      local_59._17_8_ = local_59 + 1;
      local_40 = 2;
      this_00 = (vector<double,_std::allocator<double>_> *)local_59;
      std::allocator<double>::allocator((allocator<double> *)0x1a3431);
      __l._M_array._4_4_ = iVar4;
      __l._M_array._0_4_ = in_stack_ffffffffffffff58;
      __l._M_len = (size_type)in_stack_ffffffffffffff60;
      std::vector<double,_std::allocator<double>_>::vector(this_00,__l,__a);
      std::allocator<double>::~allocator((allocator<double> *)0x1a3462);
      std::make_pair<int&,std::vector<double,std::allocator<double>>&>
                ((int *)in_stack_ffffffffffffff28,
                 (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20);
      std::
      stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
      ::push((stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
              *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      std::pair<int,_std::vector<double,_std::allocator<double>_>_>::~pair
                ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)0x1a34a9);
      addChange(in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                (int)in_stack_ffffffffffffff28,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      if (0 < *(int *)(in_RDI + 0x7c8)) {
        poVar1 = std::operator<<((ostream *)&std::cout,"PR:      Variable  ");
        in_stack_ffffffffffffff30 = (HPresolve *)std::ostream::operator<<(poVar1,local_18);
        in_stack_ffffffffffffff28 = std::operator<<((ostream *)in_stack_ffffffffffffff30," := ");
        in_stack_ffffffffffffff20 =
             (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff28,local_20);
        std::ostream::operator<<(in_stack_ffffffffffffff20,std::endl<char,std::char_traits<char>>);
      }
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xad0),4);
      *pvVar2 = *pvVar2 + 1;
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30);
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

void HPresolve::setVariablesToBoundForForcingRow(const int row, const bool isLower) {
	int k, col;
	if (iPrint > 0)
		cout << "PR: Forcing row " << row
				<< " removed. Following variables too:   nzRow=" << nzRow.at(row)
				<< endl;

	flagRow.at(row) = 0;
	addChange(FORCING_ROW, row, 0);
	k = ARstart.at(row);
	while (k < ARstart.at(row + 1)) {
		col = ARindex.at(k);
		if (flagCol.at(col)) {
			double value;
			if ((ARvalue.at(k) < 0 && isLower)
					|| (ARvalue.at(k) > 0 && !isLower))
				value = colUpper.at(col);
			else
				value = colLower.at(col);

			setPrimalValue(col, value);
			valueColDual.at(col) = colCost.at(col);
			vector<double> bnds({colLower.at(col), colUpper.at(col)});
			oldBounds.push(make_pair(col, bnds));
			addChange(FORCING_ROW_VARIABLE, 0, col);

			if (iPrint > 0)
				cout << "PR:      Variable  " << col << " := " << value << endl;
			countRemovedCols[FORCING_ROW]++;
		}
		++k;
	}

	if (nzRow.at(row) == 1)
		singRow.remove(row);

	countRemovedRows[FORCING_ROW]++;
}